

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O0

Vec_Int_t * Gia_GlaConvertToFla(Gia_Man_t *p,Vec_Int_t *vGla)

{
  int iVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  undefined4 local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vFla;
  Vec_Int_t *vGla_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  p_00 = Vec_IntStart(iVar1);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar2 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_28 = Gia_ManCi(p,iVar1 + local_2c);
      bVar2 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjId(p,pGStack_28);
    iVar1 = Vec_IntEntry(vGla,iVar1);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p_00,local_2c,1);
    }
    local_2c = local_2c + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_GlaConvertToFla( Gia_Man_t * p, Vec_Int_t * vGla )
{
    Vec_Int_t * vFla;
    Gia_Obj_t * pObj;
    int i;
    vFla = Vec_IntStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(vGla, Gia_ObjId(p, pObj)) )
            Vec_IntWriteEntry( vFla, i, 1 );
    return vFla;
}